

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ftrl.cc
# Opt level: O2

void inner_update_pistol_state_and_predict(update_data *d,float x,float *wref)

{
  float fVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  
  fVar4 = ABS(x);
  fVar5 = wref[3];
  if (wref[3] < fVar4) {
    wref[3] = fVar4;
    fVar5 = fVar4;
  }
  fVar4 = wref[1];
  fVar3 = wref[2];
  fVar5 = 1.0 / ((fVar5 + fVar3) * d->ftrl_alpha * fVar5);
  if (fVar3 < 0.0) {
    fVar3 = sqrtf(fVar3);
  }
  else {
    fVar3 = SQRT(fVar3);
  }
  fVar1 = d->ftrl_beta;
  fVar2 = wref[1];
  fVar4 = expf(fVar4 * fVar4 * 0.5 * fVar5);
  fVar5 = fVar4 * fVar3 * fVar1 * fVar2 * fVar5;
  *wref = fVar5;
  d->predict = fVar5 * x + d->predict;
  return;
}

Assistant:

void inner_update_pistol_state_and_predict(update_data& d, float x, float& wref)
{
  float* w = &wref;

  float fabs_x = fabs(x);
  if (fabs_x > w[W_MX])
    w[W_MX] = fabs_x;

  float squared_theta = w[W_ZT] * w[W_ZT];
  float tmp = 1.f / (d.ftrl_alpha * w[W_MX] * (w[W_G2] + w[W_MX]));
  w[W_XT] = sqrt(w[W_G2]) * d.ftrl_beta * w[W_ZT] * correctedExp(squared_theta / 2 * tmp) * tmp;

  d.predict += w[W_XT] * x;
}